

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::SpectrumScaledTexture::ToString_abi_cxx11_(SpectrumScaledTexture *this)

{
  string *in_RDI;
  SpectrumTextureHandle *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (in_stack_00000018,in_stack_00000010,(FloatTextureHandle *)this);
  return in_RDI;
}

Assistant:

std::string SpectrumScaledTexture::ToString() const {
    return StringPrintf("[ SpectrumScaledTexture tex: %s scale: %s ]", tex, scale);
}